

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O3

void xmlParseMisc(xmlParserCtxtPtr ctxt)

{
  xmlChar *pxVar1;
  xmlParserInputPtr pxVar2;
  
  if (ctxt->disableSAX < 2) {
    while( true ) {
      xmlSkipBlankChars(ctxt);
      pxVar2 = ctxt->input;
      if (((pxVar2->flags & 0x40) == 0) && ((long)pxVar2->end - (long)pxVar2->cur < 0xfa)) {
        xmlParserGrow(ctxt);
        pxVar2 = ctxt->input;
      }
      pxVar1 = pxVar2->cur;
      if (*pxVar1 != '<') break;
      if (pxVar1[1] == '!') {
        if (pxVar1[2] != '-') {
          return;
        }
        if (pxVar1[3] != '-') {
          return;
        }
        xmlParseComment(ctxt);
      }
      else {
        if (pxVar1[1] != '?') {
          return;
        }
        xmlParsePI(ctxt);
      }
      if (1 < ctxt->disableSAX) {
        return;
      }
    }
  }
  return;
}

Assistant:

void
xmlParseMisc(xmlParserCtxtPtr ctxt) {
    while (PARSER_STOPPED(ctxt) == 0) {
        SKIP_BLANKS;
        GROW;
        if ((RAW == '<') && (NXT(1) == '?')) {
	    xmlParsePI(ctxt);
        } else if (CMP4(CUR_PTR, '<', '!', '-', '-')) {
	    xmlParseComment(ctxt);
        } else {
            break;
        }
    }
}